

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O2

cfg_entry * cfg_db_find_entry(cfg_db *db,char *section_type,char *section_name,char *entry_name)

{
  cfg_named_section *pcVar1;
  cfg_entry *pcVar2;
  
  pcVar1 = cfg_db_find_namedsection(db,section_type,section_name);
  if (pcVar1 != (cfg_named_section *)0x0) {
    pcVar2 = (cfg_entry *)avl_find(&pcVar1->entries,entry_name);
    return pcVar2;
  }
  return (cfg_entry *)0x0;
}

Assistant:

struct cfg_entry *
cfg_db_find_entry(struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name) {
  struct cfg_named_section *named;
  struct cfg_entry *entry = NULL;

  /* get named section */
  named = cfg_db_find_namedsection(db, section_type, section_name);
  if (named != NULL) {
    entry = avl_find_element(&named->entries, entry_name, entry, node);
  }
  return entry;
}